

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

bool __thiscall Game::checkValidCard(Game *this,size_t playerID,Card firstCard,Card newCard)

{
  bool bVar1;
  reference __x;
  undefined1 local_48 [8];
  value_type cards;
  size_t playerID_local;
  Game *this_local;
  Card newCard_local;
  Card firstCard_local;
  
  cards.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)playerID;
  unique0x100000ce = newCard;
  newCard_local = firstCard;
  __x = std::
        vector<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
        ::at(&this->m_playerCards,playerID);
  std::vector<Card,_std::allocator<Card>_>::vector
            ((vector<Card,_std::allocator<Card>_> *)local_48,__x);
  bVar1 = hasCard(this,(size_t)cards.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,stack0xffffffffffffffe4);
  if (bVar1) {
    bVar1 = Ruleset::isSameType(&this->m_rules,&newCard_local,(Card *)((long)&this_local + 4));
    if (bVar1) {
      firstCard_local.m_suit._3_1_ = 1;
    }
    else {
      bVar1 = Ruleset::containsType
                        (&this->m_rules,(vector<Card,_std::allocator<Card>_> *)local_48,
                         &newCard_local);
      if (bVar1) {
        firstCard_local.m_suit._3_1_ = DIAMONDS >> 0x18;
      }
      else {
        firstCard_local.m_suit._3_1_ = 1;
      }
    }
  }
  else {
    firstCard_local.m_suit._3_1_ = DIAMONDS >> 0x18;
  }
  std::vector<Card,_std::allocator<Card>_>::~vector((vector<Card,_std::allocator<Card>_> *)local_48)
  ;
  return (bool)firstCard_local.m_suit._3_1_;
}

Assistant:

bool Game::checkValidCard(size_t playerID, Card firstCard, Card newCard) {
    auto cards = m_playerCards.at(playerID);
    //Card available?
    if (!hasCard(playerID, newCard)) return false;
    //served ?
    if (m_rules.isSameType(firstCard, newCard)) return true;
        //no need to serve?
    else if (m_rules.containsType(cards, firstCard)) return false;
    return true;
}